

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt_generic.c
# Opt level: O0

xprt_stat clnt_req_process_reply(SVCXPRT *xprt,svc_req *req)

{
  XDR *pXVar1;
  uint16_t uVar2;
  opr_rbtree_node *poVar3;
  ulong uVar4;
  clnt_req cc_k;
  clnt_req *cc;
  opr_rbtree_node *nv;
  rpc_dplx_rec *rec;
  XDR *xdrs;
  svc_req *req_local;
  SVCXPRT *xprt_local;
  
  pXVar1 = req->rq_xdrs;
  rpc_dplx_rlt((rpc_dplx_rec *)xprt,"clnt_req_process_reply",0x234);
  cc_k.cc_refreshes = (req->rq_msg).rm_xid;
  poVar3 = opr_rbtree_lookup((opr_rbtree *)(xprt[1].xp_remote.ss.__ss_padding + 0x66),
                             (opr_rbtree_node *)&cc_k.cc_wpe.arg);
  rpc_dplx_rut((rpc_dplx_rec *)xprt,"clnt_req_process_reply",0x237);
  if (poVar3 == (opr_rbtree_node *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s: %p fd %d lookup failed xid %u","clnt_req_process_reply",xprt,
                 (ulong)(uint)xprt->xp_fd,(ulong)(uint)cc_k.cc_refreshes);
    }
    xprt_local._4_4_ = (*xprt->xp_ops->xp_stat)(xprt);
  }
  else {
    cc_k._728_8_ = &poVar3[-2].parent;
    uVar2 = atomic_postclear_uint16_t_bits((uint16_t *)((long)&poVar3[0x15].right + 4),1);
    if ((uVar2 & 1) != 0) {
      svc_rqst_expire_remove((clnt_req *)cc_k._728_8_);
      *(undefined4 *)(cc_k._728_8_ + 0x2c8) = 0;
    }
    uVar2 = atomic_postset_uint16_t_bits((uint16_t *)(cc_k._728_8_ + 0x2dc),8);
    if ((uVar2 & 0xc) == 0) {
      _seterr_reply((rpc_msg *)&req->rq_msg,(rpc_err *)(cc_k._728_8_ + 0x2b0));
      if (*(int *)(cc_k._728_8_ + 0x2b8) == 0) {
        uVar4 = (**(code **)(**(long **)(cc_k._728_8_ + 0x260) + 0x10))
                          (*(undefined8 *)(cc_k._728_8_ + 0x260),cc_k._728_8_ + 200);
        if ((uVar4 & 1) == 0) {
          *(undefined4 *)(cc_k._728_8_ + 0x2b8) = 7;
          *(undefined4 *)(cc_k._728_8_ + 0x2b0) = 6;
        }
        else if (((*(long *)(cc_k._728_8_ + 0x280) != 0) &&
                 (uVar4 = (**(code **)(**(long **)(cc_k._728_8_ + 0x260) + 0x30))
                                    (*(undefined8 *)(cc_k._728_8_ + 0x260),pXVar1,
                                     *(undefined8 *)(cc_k._728_8_ + 0x280),
                                     *(undefined8 *)(cc_k._728_8_ + 0x288)), (uVar4 & 1) == 0)) &&
                (*(int *)(cc_k._728_8_ + 0x2b8) == 0)) {
          *(undefined4 *)(cc_k._728_8_ + 0x2b8) = 2;
        }
        *(undefined4 *)(cc_k._728_8_ + 0x2cc) = 0;
      }
      if ((__ntirpc_pkg_params.debug_flags & 0x4000) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s: %p fd %d xid %u result=%d","clnt_req_process_reply",xprt,
                   (ulong)(uint)xprt->xp_fd,(ulong)*(uint *)(cc_k._728_8_ + 0x2d4),
                   (ulong)*(uint *)(cc_k._728_8_ + 0x2b8));
      }
      (**(code **)(cc_k._728_8_ + 0x290))(cc_k._728_8_);
      xprt_local._4_4_ = (*xprt->xp_ops->xp_stat)(xprt);
    }
    else {
      if ((__ntirpc_pkg_params.debug_flags & 0x4000) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s: %p fd %d xid %u ignored=%d","clnt_req_process_reply",xprt,
                   (ulong)(uint)xprt->xp_fd,(ulong)*(uint *)(cc_k._728_8_ + 0x2d4),
                   (ulong)*(uint *)(cc_k._728_8_ + 0x2b8));
      }
      *(undefined4 *)(cc_k._728_8_ + 0x2cc) = 0;
      xprt_local._4_4_ = (*xprt->xp_ops->xp_stat)(xprt);
    }
  }
  return xprt_local._4_4_;
}

Assistant:

enum xprt_stat
clnt_req_process_reply(SVCXPRT *xprt, struct svc_req *req)
{
	XDR *xdrs = req->rq_xdrs;
	struct rpc_dplx_rec *rec = REC_XPRT(xprt);
	struct opr_rbtree_node *nv;
	struct clnt_req *cc;
	struct clnt_req cc_k;

	rpc_dplx_rli(rec);
	cc_k.cc_xid = req->rq_msg.rm_xid;
	nv = opr_rbtree_lookup(&rec->call_replies, &cc_k.cc_dplx);
	rpc_dplx_rui(rec);
	if (!nv) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s: %p fd %d lookup failed xid %" PRIu32,
			__func__, &rec->xprt, rec->xprt.xp_fd, cc_k.cc_xid);
		return SVC_STAT(xprt);
	}
	cc = opr_containerof(nv, struct clnt_req, cc_dplx);

	/* order dependent */
	if (atomic_postclear_uint16_t_bits(&cc->cc_flags,
					   CLNT_REQ_FLAG_EXPIRING)
	    & CLNT_REQ_FLAG_EXPIRING) {
		svc_rqst_expire_remove(cc);
		cc->cc_expire_ms = 0;	/* atomic barrier(s) */
	}

	if (atomic_postset_uint16_t_bits(&cc->cc_flags, CLNT_REQ_FLAG_ACKSYNC)
	    & (CLNT_REQ_FLAG_ACKSYNC | CLNT_REQ_FLAG_BACKSYNC)) {
		__warnx(TIRPC_DEBUG_FLAG_CLNT_REQ,
			"%s: %p fd %d xid %" PRIu32 " ignored=%d",
			__func__, xprt, xprt->xp_fd, cc->cc_xid,
			cc->cc_error.re_status);
		cc->cc_refreshes = 0;
		return SVC_STAT(xprt);
	}

	_seterr_reply(&req->rq_msg, &(cc->cc_error));
	if (cc->cc_error.re_status == RPC_SUCCESS) {
		if (!AUTH_VALIDATE(cc->cc_auth, &(cc->cc_verf))) {
			cc->cc_error.re_status = RPC_AUTHERROR;
			cc->cc_error.re_why = AUTH_INVALIDRESP;
		} else if (cc->cc_reply.proc
			   && !AUTH_UNWRAP(cc->cc_auth, xdrs,
					   cc->cc_reply.proc,
					   cc->cc_reply.where)) {
			if (cc->cc_error.re_status == RPC_SUCCESS)
				cc->cc_error.re_status = RPC_CANTDECODERES;
		}
		cc->cc_refreshes = 0;
	}

	__warnx(TIRPC_DEBUG_FLAG_CLNT_REQ,
		"%s: %p fd %d xid %" PRIu32 " result=%d",
		__func__, xprt, xprt->xp_fd, cc->cc_xid,
		cc->cc_error.re_status);

	(*cc->cc_process_cb)(cc);
	return SVC_STAT(xprt);
}